

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

EStatusCodeAndObjectIDTypeList * __thiscall
PDFWriter::CreateFormXObjectsFromPDF
          (EStatusCodeAndObjectIDTypeList *__return_storage_ptr__,PDFWriter *this,
          IByteReaderWithPosition *inPDFStream,PDFPageRange *inPageRange,
          EPDFPageBox inPageBoxToUseAsFormBox,double *inTransformationMatrix,
          ObjectIDTypeList *inCopyAdditionalObjects,PDFParsingOptions *inParsingOptions)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  ObjectIDTypeList local_38;
  
  local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&local_38;
  local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_38;
  local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node._M_size =
       0;
  PDFHummus::DocumentContext::CreateFormXObjectsFromPDF
            (__return_storage_ptr__,&this->mDocumentContext,inPDFStream,inParsingOptions,inPageRange
             ,inPageBoxToUseAsFormBox,inTransformationMatrix,inCopyAdditionalObjects,&local_38);
  p_Var2 = local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (local_38.super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl._M_node.
      super__List_node_base._M_next != (_List_node_base *)&local_38) {
    do {
      p_Var1 = p_Var2->_M_next;
      operator_delete(p_Var2,0x18);
      p_Var2 = p_Var1;
    } while (p_Var1 != (_List_node_base *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

EStatusCodeAndObjectIDTypeList PDFWriter::CreateFormXObjectsFromPDF(IByteReaderWithPosition* inPDFStream,
																	const PDFPageRange& inPageRange,
																	EPDFPageBox inPageBoxToUseAsFormBox,
																	const double* inTransformationMatrix,
																	const ObjectIDTypeList& inCopyAdditionalObjects,
																	const PDFParsingOptions& inParsingOptions)
{
	return mDocumentContext.CreateFormXObjectsFromPDF(inPDFStream,inParsingOptions,inPageRange,inPageBoxToUseAsFormBox,inTransformationMatrix,inCopyAdditionalObjects);
}